

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O2

void __thiscall
chrono::ChBodyEasyClusterOfSpheres::SetupBody
          (ChBodyEasyClusterOfSpheres *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *positions,
          vector<double,_std::allocator<double>_> *radii,double density,bool visualize,bool collide,
          shared_ptr<chrono::ChMaterialSurface> *material)

{
  shared_ptr<chrono::collision::ChCollisionModel> *psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  element_type *this_00;
  uint uVar9;
  pointer pCVar10;
  ulong uVar11;
  pointer pCVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  ChVector<double> local_1d8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *local_1c0;
  shared_ptr<chrono::ChVisualModel> vmodel;
  double local_1a8;
  shared_ptr<chrono::ChSphereShape> vshape;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> offset_positions;
  ChMatrix33<double> totinertia;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_e8;
  ChVector<double> v;
  ChQuaternion<double> local_50;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_1c0 = &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>;
  if (((long)(positions->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
      (long)(positions->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start) / 0x18 !=
      (long)(radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    __assert_fail("positions.size() == radii.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                  ,0x1ee,
                  "void chrono::ChBodyEasyClusterOfSpheres::SetupBody(std::vector<ChVector<>> &, std::vector<double> &, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                 );
  }
  local_1d8.m_data[0] = VNULL;
  local_1d8.m_data[1] = DAT_011dd3e0;
  local_1d8.m_data[2] = DAT_011dd3e8;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&totinertia);
  pCVar12 = (positions->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = 0;
  local_1a8 = 0.0;
  while( true ) {
    pCVar10 = (positions->
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar11 = (ulong)uVar9;
    if ((ulong)(((long)pCVar10 - (long)pCVar12) / 0x18) <= uVar11) break;
    dVar14 = pow((radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar11],3.0);
    pCVar12 = (positions->
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    dVar14 = dVar14 * 4.1887902047863905 * density;
    uVar9 = uVar9 + 1;
    dVar25 = 1.0 / (local_1a8 + dVar14);
    local_1d8.m_data[2] =
         dVar25 * (local_1a8 * local_1d8.m_data[2] + dVar14 * pCVar12[uVar11].m_data[2]);
    local_1d8.m_data[0] =
         dVar25 * (local_1a8 * local_1d8.m_data[0] + dVar14 * pCVar12[uVar11].m_data[0]);
    local_1d8.m_data[1] =
         dVar25 * (local_1a8 * local_1d8.m_data[1] + dVar14 * pCVar12[uVar11].m_data[1]);
    local_1a8 = local_1a8 + dVar14;
  }
  uVar9 = 0;
  while (uVar11 = (ulong)uVar9, uVar11 < (ulong)(((long)pCVar10 - (long)pCVar12) / 0x18)) {
    dVar14 = pow((radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar11],3.0);
    dVar25 = dVar14 * 4.1887902047863905 * density;
    dVar14 = (radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar11];
    pCVar12 = (positions->
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    dVar14 = dVar25 * 0.4 * dVar14 * dVar14;
    auVar6._8_8_ = local_1d8.m_data[1];
    auVar6._0_8_ = local_1d8.m_data[0];
    auVar13 = vsubpd_avx(*(undefined1 (*) [16])pCVar12[uVar11].m_data,auVar6);
    v.m_data[0] = auVar13._0_8_;
    v.m_data[1] = auVar13._8_8_;
    v.m_data[2] = pCVar12[uVar11].m_data[2] - local_1d8.m_data[2];
    auVar18._0_8_ = ChVector<double>::Length2(&v);
    auVar18._8_56_ = extraout_var;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = v.m_data[0];
    auVar4 = vfnmadd213sd_fma(auVar21,auVar21,auVar18._0_16_);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar14;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar25;
    auVar13 = vfmadd132sd_fma(auVar4,auVar15,auVar13);
    totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         auVar13._0_8_ +
         totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar19._0_8_ = ChVector<double>::Length2(&v);
    auVar19._8_56_ = extraout_var_00;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = v.m_data[1];
    auVar13 = vfnmadd213sd_fma(auVar22,auVar22,auVar19._0_16_);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar14;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar25;
    auVar13 = vfmadd132sd_fma(auVar13,auVar16,auVar4);
    totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar13._0_8_ +
         totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar20._0_8_ = ChVector<double>::Length2(&v);
    auVar20._8_56_ = extraout_var_01;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = v.m_data[2];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar25;
    auVar8._8_8_ = v.m_data[2];
    auVar8._0_8_ = v.m_data[1];
    uVar9 = uVar9 + 1;
    auVar13 = vfnmadd231sd_fma(auVar20._0_16_,auVar23,auVar23);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar14;
    auVar13 = vfmadd213sd_fma(auVar13,auVar7,auVar2);
    auVar24._8_8_ = dVar25;
    auVar24._0_8_ = dVar25;
    totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar13._0_8_ +
         totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar5._8_8_ = v.m_data[0];
    auVar5._0_8_ = v.m_data[0];
    auVar13 = vmulpd_avx512vl(auVar8,auVar5);
    totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._8_16_ =
         vfnmadd213pd_fma(auVar24,auVar13,
                          (undefined1  [16])
                          totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array._8_16_);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = v.m_data[2] * v.m_data[1];
    auVar13 = vfnmadd213sd_fma(auVar17,auVar7,auVar3);
    totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         auVar13._0_8_;
    totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)vmovlpd_avx((undefined1  [16])
                             totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array._8_16_);
    totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         (double)vmovhpd_avx((undefined1  [16])
                             totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array._8_16_);
    pCVar12 = (positions->
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         totinertia.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    pCVar10 = (positions->
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  (this->super_ChBody).density = (float)density;
  ChVariablesBodyOwnMass::SetBodyMass(&(this->super_ChBody).variables,local_1a8);
  ChBody::SetInertia(&this->super_ChBody,&totinertia);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&offset_positions,positions);
  uVar9 = 0;
  while( true ) {
    if ((ulong)(((long)(positions->
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(positions->
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x18) <= (ulong)uVar9) break;
    ChVector<double>::operator-=
              (offset_positions.
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar9,&local_1d8);
    uVar9 = uVar9 + 1;
  }
  if (collide) {
    if (((__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)&local_1c0->_M_ptr)
        ->_M_ptr == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0x214,
                    "void chrono::ChBodyEasyClusterOfSpheres::SetupBody(std::vector<ChVector<>> &, std::vector<double> &, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    psVar1 = &(this->super_ChBody).collision_model;
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)&v,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    (**(code **)(*(long *)v.m_data[0] + 0x18))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
    uVar9 = 0;
    while( true ) {
      uVar11 = (ulong)uVar9;
      if ((ulong)(((long)(positions->
                         super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(positions->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar11) break;
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &v,&psVar1->
                       super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  );
      dVar14 = v.m_data[0];
      std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_e8,local_1c0);
      (**(code **)(*(long *)dVar14 + 0x28))
                ((radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar11],dVar14,&local_e8,
                 offset_positions.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar11);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      uVar9 = uVar9 + 1;
    }
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)&v,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    (**(code **)(*(long *)v.m_data[0] + 0x20))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
    ChBody::SetCollide(&this->super_ChBody,true);
  }
  if (visualize) {
    std::make_shared<chrono::ChVisualModel>();
    uVar9 = 0;
    while( true ) {
      uVar11 = (ulong)uVar9;
      if ((ulong)(((long)(positions->
                         super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(positions->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar11) break;
      chrono_types::make_shared<chrono::ChSphereShape,_0>();
      this_00 = vmodel.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ((vshape.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      gsphere).rad = (radii->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar11];
      std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChSphereShape,void>
                (local_f8,&vshape.
                           super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>);
      local_50.m_data[0] = 1.0;
      local_50.m_data[3] = 0.0;
      local_50.m_data[1] = 0.0;
      local_50.m_data[2] = 0.0;
      ChFrame<double>::ChFrame
                ((ChFrame<double> *)&v,
                 offset_positions.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar11,&local_50);
      ChVisualModel::AddShape
                (this_00,(shared_ptr<chrono::ChVisualShape> *)local_f8,(ChFrame<double> *)&v);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&vshape.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      uVar9 = uVar9 + 1;
    }
    std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_108,
               &vmodel.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>);
    ChPhysicsItem::AddVisualModel
              ((ChPhysicsItem *)this,(shared_ptr<chrono::ChVisualModel> *)&local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&vmodel.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  ~_Vector_base(&offset_positions.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               );
  return;
}

Assistant:

void ChBodyEasyClusterOfSpheres::SetupBody(std::vector<ChVector<>>& positions,
                                           std::vector<double>& radii,
                                           double density,
                                           bool visualize,
                                           bool collide,
                                           std::shared_ptr<ChMaterialSurface> material) {
    assert(positions.size() == radii.size());

    double totmass = 0;
    ChMatrix33<> totinertia;
    ChVector<> baricenter = VNULL;
    totinertia.setZero();
    for (unsigned int i = 0; i < positions.size(); ++i) {
        double sphmass = density * ((4.0 / 3.0) * CH_C_PI * pow(radii[i], 3));
        baricenter = (baricenter * totmass + positions[i] * sphmass) / (totmass + sphmass);
        totmass += sphmass;
    }
    for (unsigned int i = 0; i < positions.size(); ++i) {
        double sphmass = density * ((4.0 / 3.0) * CH_C_PI * pow(radii[i], 3));
        double sphinertia = (2.0 / 5.0) * sphmass * pow(radii[i], 2);

        // Huygens-Steiner parallel axis theorem:
        ChVector<> dist = positions[i] - baricenter;
        totinertia(0, 0) += sphinertia + sphmass * (dist.Length2() - dist.x() * dist.x());
        totinertia(1, 1) += sphinertia + sphmass * (dist.Length2() - dist.y() * dist.y());
        totinertia(2, 2) += sphinertia + sphmass * (dist.Length2() - dist.z() * dist.z());
        totinertia(0, 1) += sphmass * (-dist.x() * dist.y());
        totinertia(0, 2) += sphmass * (-dist.x() * dist.z());
        totinertia(1, 2) += sphmass * (-dist.y() * dist.z());
        totinertia(1, 0) = totinertia(0, 1);
        totinertia(2, 0) = totinertia(0, 2);
        totinertia(2, 1) = totinertia(1, 2);
    }

    this->SetDensity((float)density);
    this->SetMass(totmass);
    this->SetInertia(totinertia);

    // Translate the cluster baricenter so that body origin is also baricenter
    std::vector<ChVector<>> offset_positions = positions;
    for (unsigned int i = 0; i < positions.size(); ++i)
        offset_positions[i] -= baricenter;

    if (collide) {
        assert(material);
        GetCollisionModel()->ClearModel();
        for (unsigned int i = 0; i < positions.size(); ++i) {
            GetCollisionModel()->AddSphere(material, radii[i], offset_positions[i]);  // radius, radius, height on y
        }
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }
    if (visualize) {
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        for (unsigned int i = 0; i < positions.size(); ++i) {
            auto vshape = chrono_types::make_shared<ChSphereShape>();
            vshape->GetSphereGeometry().rad = radii[i];
            vmodel->AddShape(vshape, ChFrame<>(offset_positions[i]));
        }
        this->AddVisualModel(vmodel);
    }
}